

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,long,duckdb::BinaryStandardOperatorWrapper,duckdb::InstrOperator,bool,false,true>
               (string_t *ldata,string_t *rdata,long *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  unsigned_long *puVar1;
  bool bVar2;
  ulong uVar3;
  idx_t iVar4;
  utf8proc_ssize_t uVar5;
  char *pcVar6;
  utf8proc_ssize_t len_2;
  undefined8 uVar7;
  idx_t iVar8;
  utf8proc_ssize_t len;
  idx_t iVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  anon_union_16_2_67f50693_for_value local_a0;
  ulong local_90;
  ulong local_88;
  string_t *local_80;
  ulong local_78;
  char *local_70;
  string_t *local_68;
  long *local_60;
  anon_union_16_2_67f50693_for_value local_58;
  utf8proc_int32_t local_44;
  ulong local_40;
  ValidityMask *local_38;
  
  local_88 = count;
  local_80 = rdata;
  local_68 = ldata;
  local_60 = result_data;
  local_38 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      local_90 = *(ulong *)&rdata->value;
      pcVar6 = (rdata->value).pointer.ptr;
      iVar4 = 0;
      do {
        local_a0._0_8_ = *(undefined8 *)&local_68[iVar4].value;
        local_a0.pointer.ptr = local_68[iVar4].value.pointer.ptr;
        local_58._0_8_ = local_90;
        local_58.pointer.ptr = pcVar6;
        iVar9 = FindStrInStr((string_t *)&local_a0.pointer,(string_t *)&local_58.pointer);
        if (iVar9 == 0xffffffffffffffff) {
          lVar11 = 0;
        }
        else if ((long)iVar9 < 1) {
          lVar11 = 1;
        }
        else {
          uVar7 = local_a0.pointer.prefix;
          if (0xc < local_a0.pointer.length) {
            uVar7 = local_a0.pointer.ptr;
          }
          lVar11 = 1;
          do {
            uVar5 = utf8proc_iterate((utf8proc_uint8_t *)uVar7,iVar9,&local_44);
            uVar7 = uVar7 + uVar5;
            lVar11 = lVar11 + 1;
            iVar8 = iVar9 - uVar5;
            bVar2 = uVar5 <= (long)iVar9;
            iVar9 = iVar8;
          } while (iVar8 != 0 && bVar2);
        }
        local_60[iVar4] = lVar11;
        iVar4 = iVar4 + 1;
      } while (iVar4 != local_88);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_40 = count + 0x3f >> 6;
    uVar10 = 0;
    local_78 = 0;
    do {
      puVar1 = (local_38->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar12 = uVar10 + 0x40;
        if (local_88 <= uVar10 + 0x40) {
          uVar12 = local_88;
        }
LAB_0105553c:
        uVar3 = uVar10;
        if (uVar10 < uVar12) {
          local_90 = *(ulong *)&local_80->value;
          local_70 = (local_80->value).pointer.ptr;
          do {
            local_a0._0_8_ = *(undefined8 *)&local_68[uVar10].value;
            local_a0.pointer.ptr = local_68[uVar10].value.pointer.ptr;
            local_58._0_8_ = local_90;
            local_58.pointer.ptr = local_70;
            iVar4 = FindStrInStr((string_t *)&local_a0.pointer,(string_t *)&local_58.pointer);
            if (iVar4 == 0xffffffffffffffff) {
              lVar11 = 0;
            }
            else if ((long)iVar4 < 1) {
              lVar11 = 1;
            }
            else {
              uVar7 = local_a0.pointer.prefix;
              if (0xc < local_a0.pointer.length) {
                uVar7 = local_a0.pointer.ptr;
              }
              lVar11 = 1;
              do {
                uVar5 = utf8proc_iterate((utf8proc_uint8_t *)uVar7,iVar4,&local_44);
                uVar7 = uVar7 + uVar5;
                lVar11 = lVar11 + 1;
                iVar9 = iVar4 - uVar5;
                bVar2 = uVar5 <= (long)iVar4;
                iVar4 = iVar9;
              } while (iVar9 != 0 && bVar2);
            }
            local_60[uVar10] = lVar11;
            uVar10 = uVar10 + 1;
            uVar3 = uVar12;
          } while (uVar10 != uVar12);
        }
      }
      else {
        pcVar6 = (char *)puVar1[local_78];
        uVar12 = uVar10 + 0x40;
        if (local_88 <= uVar10 + 0x40) {
          uVar12 = local_88;
        }
        uVar3 = uVar12;
        if (pcVar6 != (char *)0x0) {
          if (pcVar6 == (char *)0xffffffffffffffff) goto LAB_0105553c;
          uVar3 = uVar10;
          uVar13 = uVar10;
          local_90 = uVar12;
          local_70 = pcVar6;
          if (uVar10 < uVar12) {
            do {
              if (((ulong)pcVar6 >> ((ulong)(uint)((int)uVar13 - (int)uVar10) & 0x3f) & 1) != 0) {
                local_a0._0_8_ = *(undefined8 *)&local_68[uVar13].value;
                local_a0.pointer.ptr = local_68[uVar13].value.pointer.ptr;
                local_58._0_8_ = *(undefined8 *)&local_80->value;
                local_58.pointer.ptr = (local_80->value).pointer.ptr;
                iVar4 = FindStrInStr((string_t *)&local_a0.pointer,(string_t *)&local_58.pointer);
                if (iVar4 == 0xffffffffffffffff) {
                  lVar11 = 0;
                }
                else if ((long)iVar4 < 1) {
                  lVar11 = 1;
                }
                else {
                  uVar7 = local_a0.pointer.prefix;
                  if (0xc < local_a0.pointer.length) {
                    uVar7 = local_a0.pointer.ptr;
                  }
                  lVar11 = 1;
                  do {
                    uVar5 = utf8proc_iterate((utf8proc_uint8_t *)uVar7,iVar4,&local_44);
                    uVar7 = uVar7 + uVar5;
                    lVar11 = lVar11 + 1;
                    iVar9 = iVar4 - uVar5;
                    bVar2 = uVar5 <= (long)iVar4;
                    iVar4 = iVar9;
                  } while (iVar9 != 0 && bVar2);
                }
                local_60[uVar13] = lVar11;
                pcVar6 = local_70;
                uVar12 = local_90;
              }
              uVar13 = uVar13 + 1;
              uVar3 = uVar12;
            } while (uVar13 != uVar12);
          }
        }
      }
      uVar10 = uVar3;
      local_78 = local_78 + 1;
    } while (local_78 != local_40);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}